

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

int gzeof(gzFile file)

{
  undefined4 local_28;
  undefined1 local_21;
  gz_statep state;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = 0;
  }
  else if ((*file == 0x1c4f) || (*file == 0x79b1)) {
    if (*file == 0x1c4f) {
      local_21 = false;
      if ((*(int *)((long)file + 0x3c) != 0) && (local_21 = false, *(int *)((long)file + 0x80) == 0)
         ) {
        local_21 = *(int *)((long)file + 0x38) == 0;
      }
      local_28 = (uint)local_21;
    }
    else {
      local_28 = 0;
    }
    file_local._4_4_ = local_28;
  }
  else {
    file_local._4_4_ = 0;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzeof(gzFile file)
{
    gz_statep state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return 0;
    state = (gz_statep)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return 0;

    /* return end-of-file state */
    return state->mode == GZ_READ ?
        (state->eof && state->strm.avail_in == 0 && state->have == 0) : 0;
}